

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kbcore.c
# Opt level: O0

kbcore_t * kbcore_init(cmd_ln_t *config)

{
  mdef_t *mdef;
  cmn_type_t cmn;
  agc_type_t agc;
  int iVar1;
  int32 iVar2;
  kbcore_t *kbc;
  char *pcVar3;
  cmd_ln_t *pcVar4;
  long lVar5;
  logmath_t *plVar6;
  char *pcVar7;
  long lVar8;
  feat_t *pfVar9;
  long lVar10;
  dict_t *pdVar11;
  subvq_t *psVar12;
  gs_t *pgVar13;
  fillpen_t *pfVar14;
  dict2pid_t *pdVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  char *local_b8;
  bool local_a1;
  bool local_79;
  int32 composite;
  char *gsfile;
  char *subvqfile;
  char *fdictfile;
  char *pfile;
  char *str;
  s3cipid_t sil;
  int i;
  kbcore_t *kb;
  cmd_ln_t *config_local;
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
          ,0x1bc,"Begin Initialization of Core Models:\n");
  kbc = (kbcore_t *)
        __ckd_calloc__(1,0x80,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
                       ,0x1be);
  kbc->config = config;
  kbc->fcb = (feat_t *)0x0;
  kbc->mdef = (mdef_t *)0x0;
  kbc->dict = (dict_t *)0x0;
  kbc->dict2pid = (dict2pid_t *)0x0;
  kbc->fillpen = (fillpen_t *)0x0;
  kbc->mgau = (mgau_model_t *)0x0;
  kbc->svq = (subvq_t *)0x0;
  kbc->tmat = (tmat_t *)0x0;
  pcVar3 = cmd_ln_str_r(config,"-hmm");
  if (pcVar3 != (char *)0x0) {
    pcVar3 = cmd_ln_str_r(config,"-hmm");
    pcVar3 = string_join(pcVar3,"/feat.params",0);
    pcVar4 = cmd_ln_parse_file_r(config,feat_defn,pcVar3,0);
    if (pcVar4 == (cmd_ln_t *)0x0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
              ,0x1d0,"Parsed model-specific feature parameters from %s\n",pcVar3);
    }
    ckd_free(pcVar3);
  }
  dVar16 = cmd_ln_float_r(config,"-logbase");
  lVar5 = cmd_ln_int_r(config,"-log3table");
  plVar6 = logmath_init((float64)dVar16,0,(int)lVar5);
  kbc->logmath = plVar6;
  if (plVar6 == (logmath_t *)0x0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
            ,0x1d7,"Error in logmath_init, exit\n");
    exit(1);
  }
  logs3_report(kbc->logmath);
  pcVar3 = cmd_ln_str_r(config,"-feat");
  if (pcVar3 == (char *)0x0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
            ,0x1dd,"Please specify the feature type using -feat\n");
    exit(1);
  }
  pcVar7 = cmd_ln_str_r(config,"-cmn");
  cmn = cmn_type_from_str(pcVar7);
  lVar5 = cmd_ln_int_r(config,"-varnorm");
  pcVar7 = cmd_ln_str_r(config,"-agc");
  agc = agc_type_from_str(pcVar7);
  lVar8 = cmd_ln_int_r(config,"-ceplen");
  pfVar9 = feat_init(pcVar3,cmn,(uint)(lVar5 != 0),agc,1,(int32)lVar8);
  kbc->fcb = pfVar9;
  if (pfVar9 == (feat_t *)0x0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
            ,0x1e4,"feat_init(%s) failed\n",pcVar3);
    exit(1);
  }
  iVar1 = cmd_ln_exists_r(config,"-cmninit");
  if (iVar1 != 0) {
    pfVar9 = kbc->fcb;
    pcVar3 = cmd_ln_str_r(config,"-cmninit");
    set_cmninit(pfVar9,pcVar3);
  }
  pcVar3 = cmd_ln_str_r(config,"-senmgau");
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
          ,0x1eb,"%s\n",pcVar3);
  iVar1 = strcmp(pcVar3,".cont.");
  if (iVar1 == 0) {
    if (kbc->fcb->n_stream != 1) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
              ,0x1f0,"#Feature streams(%d) in the feature for continuous HMM!= 1\n",
              (ulong)(uint)kbc->fcb->n_stream);
      exit(1);
    }
  }
  else {
    iVar1 = strcmp(pcVar3,".semi.");
    if (iVar1 != 0) {
      iVar1 = strcmp(pcVar3,".s3cont.");
      if (iVar1 == 0) {
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
                ,0x1f6,"Secret Mode .s3cont. is used!!\n");
      }
      else {
        iVar1 = strcmp(pcVar3,".s2semi.");
        if (iVar1 != 0) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
                  ,0x200,"Feature should be either .semi. or .cont.\n");
          exit(1);
        }
        if (kbc->fcb->n_stream != 4) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
                  ,0x1fc,"#Feature streams(%d) in the feature for semi-continuous HMM!= 4\n",
                  (ulong)(uint)kbc->fcb->n_stream);
          exit(1);
        }
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
                ,0x1fd,"Secret Mode .s2semi. is used!!\n");
      }
    }
  }
  feat_report(kbc->fcb);
  s3_am_init(kbc);
  if (kbc->mdef == (mdef_t *)0x0) {
    __assert_fail("kb->mdef != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
                  ,0x20b,"kbcore_t *kbcore_init(cmd_ln_t *)");
  }
  pcVar3 = cmd_ln_str_r(config,"-dict");
  if (pcVar3 == (char *)0x0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
            ,0x21b,"Dictionary file is not specified. \n");
    exit(1);
  }
  local_b8 = cmd_ln_str_r(config,"-fdict");
  mdef = kbc->mdef;
  lVar5 = cmd_ln_int_r(config,"-lts_mismatch");
  lVar8 = cmd_ln_int_r(config,"-mdef_fillers");
  lVar10 = cmd_ln_int_r(config,"-mdef_fillers");
  local_79 = false;
  if (lVar10 != 0) {
    pcVar7 = cmd_ln_str_r(config,"-mode");
    iVar1 = strcmp("allphone",pcVar7);
    local_a1 = true;
    if (iVar1 != 0) {
      lVar10 = cmd_ln_int_r(config,"-op_mode");
      local_a1 = (int)lVar10 == 1;
    }
    local_79 = local_a1;
  }
  pdVar11 = dict_init(mdef,pcVar3,local_b8,(uint)(lVar5 != 0),(uint)(lVar8 != 0),(uint)local_79,1);
  kbc->dict = pdVar11;
  if (pdVar11 == (dict_t *)0x0) {
    if (local_b8 == (char *)0x0) {
      local_b8 = "";
    }
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
            ,0x218,"dict_init(%s,%s) failed\n",pcVar3,local_b8);
    exit(1);
  }
  if (kbc->dict == (dict_t *)0x0) {
    __assert_fail("kb->dict != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
                  ,0x21e,"kbcore_t *kbcore_init(cmd_ln_t *)");
  }
  dict_report(kbc->dict);
  if (kbc->mgau == (mgau_model_t *)0x0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
            ,0x23d,"Slow GMM computation is used, SVQ and GS will not be used\n");
  }
  else {
    pcVar3 = cmd_ln_str_r(config,"-subvq");
    pcVar7 = cmd_ln_str_r(config,"-gs");
    if ((pcVar3 != (char *)0x0) && (pcVar7 != (char *)0x0)) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
              ,0x228,
              "Currently there is no combination scheme of gs and svq in Gaussian Selection\n");
      exit(1);
    }
    if (pcVar3 != (char *)0x0) {
      dVar16 = cmd_ln_float_r(config,"-varfloor");
      psVar12 = subvq_init(pcVar3,(float64)(double)(float)dVar16,-1,kbc->mgau,config,kbc->logmath);
      kbc->svq = psVar12;
      if (psVar12 == (subvq_t *)0x0) {
        dVar16 = cmd_ln_float_r(config,"-varfloor");
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
                ,0x22f,"subvq_init (%s, %e, -1) failed\n",(double)(float)dVar16,pcVar3);
        exit(1);
      }
    }
    if (pcVar7 != (char *)0x0) {
      pgVar13 = gs_read(pcVar7,kbc->logmath);
      kbc->gs = pgVar13;
      if (pgVar13 == (gs_t *)0x0) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
                ,0x234,"gs_read(%s) failed\n",pcVar7);
        exit(1);
      }
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
              ,0x237,"After reading the number of senones: %d\n",(ulong)(uint)kbc->gs->n_mgau);
    }
  }
  if (kbc->dict == (dict_t *)0x0) {
    __assert_fail("kb->dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
                  ,0x240,"kbcore_t *kbcore_init(cmd_ln_t *)");
  }
  pcVar3 = cmd_ln_str_r(config,"-fillpen");
  if ((pcVar3 != (char *)0x0) || (kbc->dict != (dict_t *)0x0)) {
    if (kbc->dict == (dict_t *)0x0) {
      pcVar3 = cmd_ln_str_r(config,"-fillpen");
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
              ,0x25c,"No dictionary for associating filler penalty file(%s)\n",pcVar3);
      exit(1);
    }
    pdVar11 = kbc->dict;
    pcVar3 = cmd_ln_str_r(config,"-fillpen");
    dVar16 = cmd_ln_float_r(config,"-silprob");
    dVar17 = cmd_ln_float_r(config,"-fillprob");
    dVar18 = cmd_ln_float_r(config,"-lw");
    dVar19 = cmd_ln_float_r(config,"-wip");
    pfVar14 = fillpen_init(pdVar11,pcVar3,(float64)(double)(float)dVar16,
                           (float64)(double)(float)dVar17,(float64)(double)(float)dVar18,
                           (float64)(double)(float)dVar19,kbc->logmath);
    kbc->fillpen = pfVar14;
    if (pfVar14 == (fillpen_t *)0x0) {
      pcVar3 = cmd_ln_str_r(config,"-fillpen");
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
              ,0x266,"fillpen_init(%s) failed\n",pcVar3);
      exit(1);
    }
  }
  fillpen_report(kbc->fillpen);
  if (kbc->tmat == (tmat_t *)0x0) {
    __assert_fail("kb->tmat",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
                  ,0x26d,"kbcore_t *kbcore_init(cmd_ln_t *)");
  }
  iVar2 = tmat_chk_1skip(kbc->tmat);
  if (-1 < iVar2) {
    if ((kbc->mdef != (mdef_t *)0x0) && (kbc->dict != (dict_t *)0x0)) {
      pdVar15 = dict2pid_build(kbc->mdef,kbc->dict,1,kbc->logmath);
      kbc->dict2pid = pdVar15;
    }
    dict2pid_report(kbc->dict2pid);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
            ,0x27f,"Inside kbcore: Verifying models consistency ...... \n");
    if (((kbc->fcb != (feat_t *)0x0) && (kbc->mgau != (mgau_model_t *)0x0)) &&
       (kbc->fcb->out_dim != kbc->mgau->veclen)) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
              ,0x285,"Feature streamlen(%d) != mgau streamlen(%d)\n",(ulong)kbc->fcb->out_dim,
              (ulong)(uint)kbc->mgau->veclen);
      exit(1);
    }
    if ((-1 < kbc->dict->startwid) && (-1 < kbc->dict->finishwid)) {
      if (-1 < kbc->mdef->sil) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
                ,0x295,"End of Initialization of Core Models:\n");
        return kbc;
      }
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
              ,0x292,"Silence phone \'%s\' not in mdef\n","SIL");
      exit(1);
    }
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
            ,0x28d,"%s or %s not in dictionary\n","<s>","</s>");
    exit(1);
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
          ,0x271,
          "Transition matrices contain arcs skipping more than 1 state, not supported in s3.x\'s decode\n"
         );
  exit(1);
}

Assistant:

kbcore_t *
kbcore_init(cmd_ln_t *config)
{
    kbcore_t *kb;
    int i;
    s3cipid_t sil;
    char const *str;

    E_INFO("Begin Initialization of Core Models:\n");

    kb = (kbcore_t *) ckd_calloc(1, sizeof(kbcore_t));
    kb->config = config;
    kb->fcb = NULL;
    kb->mdef = NULL;
    kb->dict = NULL;
    kb->dict2pid = NULL;
    kb->fillpen = NULL;

    kb->mgau = NULL;
    kb->svq = NULL;
    kb->tmat = NULL;

    /* Look for a feat.params very early on, because it influences
     * everything below. */
    if (cmd_ln_str_r(config, "-hmm")) {
        char *pfile;
        pfile = string_join(cmd_ln_str_r(config, "-hmm"), "/feat.params", NULL);
        if (cmd_ln_parse_file_r(config, feat_defn, pfile, FALSE) == 0) {
            E_INFO("Parsed model-specific feature parameters from %s\n", pfile);
        }
        ckd_free(pfile);
    }

    if ((kb->logmath = logmath_init(cmd_ln_float64_r(config, "-logbase"), 0,
                                    cmd_ln_int32_r(config, "-log3table"))) == NULL)
        E_FATAL("Error in logmath_init, exit\n");

    if (REPORT_KBCORE)
        logs3_report(kb->logmath);

    if (!(str = cmd_ln_str_r(config, "-feat")))
        E_FATAL("Please specify the feature type using -feat\n");
    else {
        if ((kb->fcb =
             feat_init(str, cmn_type_from_str(cmd_ln_str_r(config, "-cmn")),
                       cmd_ln_boolean_r(config, "-varnorm"),
                       agc_type_from_str(cmd_ln_str_r(config, "-agc")),
                       REPORT_KBCORE, cmd_ln_int32_r(config, "-ceplen"))) == NULL)
            E_FATAL("feat_init(%s) failed\n", str);

        if (cmd_ln_exists_r(config, "-cmninit")) {
            set_cmninit(kb->fcb, cmd_ln_str_r(config, "-cmninit"));
        }

        str = cmd_ln_str_r(config, "-senmgau");
        E_INFO("%s\n", str);
        if (strcmp(str, ".cont.") == 0) {
            if (feat_n_stream(kb->fcb) != 1)
                E_FATAL
                    ("#Feature streams(%d) in the feature for continuous HMM!= 1\n",
                     feat_n_stream(kb->fcb));
        }
        else if (strcmp(str, ".semi.") == 0) {
        }
        else if (strcmp(str, ".s3cont.") == 0) {

            E_WARN("Secret Mode .s3cont. is used!!\n");
        }
        else if (strcmp(str, ".s2semi.") == 0) {
            if (feat_n_stream(kb->fcb) != 4)
                E_FATAL
                    ("#Feature streams(%d) in the feature for semi-continuous HMM!= 4\n",
                     feat_n_stream(kb->fcb));
            E_WARN("Secret Mode .s2semi. is used!!\n");
        }
        else {
            E_FATAL("Feature should be either .semi. or .cont.\n");
        }
    }

    if (REPORT_KBCORE) {
        feat_report(kb->fcb);
    }

    /* Initialize sphinx 3 hmm */
    s3_am_init(kb);

    assert(kb->mdef != NULL);

    if ((str = cmd_ln_str_r(config, "-dict"))) {
        char const *fdictfile = cmd_ln_str_r(config, "-fdict");

        if ((kb->dict =
             dict_init(kb->mdef, str, fdictfile,
                       cmd_ln_boolean_r(config, "-lts_mismatch"),
		       cmd_ln_boolean_r(config, "-mdef_fillers"),
		       (cmd_ln_boolean_r(config, "-mdef_fillers")
			&& (!strcmp("allphone", cmd_ln_str_r(config, "-mode")) 
			    || cmd_ln_int32_r(config, "-op_mode") == 1)),
                       REPORT_KBCORE)) == NULL)
            E_FATAL("dict_init(%s,%s) failed\n", str, fdictfile ? fdictfile : "");
    }
    else {
        E_FATAL("Dictionary file is not specified. \n");
    }

    assert(kb->dict != NULL);
    if (REPORT_KBCORE) {
        dict_report(kb->dict);
    }

    if (kb->mgau) {
        char const *subvqfile = cmd_ln_str_r(config, "-subvq");
        char const *gsfile = cmd_ln_str_r(config, "-gs");
        if (subvqfile && gsfile) {
            E_FATAL
                ("Currently there is no combination scheme of gs and svq in Gaussian Selection\n");
        }
        if (subvqfile) {
            if ((kb->svq =
                 subvq_init(subvqfile, cmd_ln_float32_r(config, "-varfloor"),
                            -1, kb->mgau, config, kb->logmath)) == NULL)
                E_FATAL("subvq_init (%s, %e, -1) failed\n", subvqfile,
                        cmd_ln_float32_r(config, "-varfloor"));
        }

        if (gsfile) {
            if ((kb->gs = gs_read(gsfile, kb->logmath)) == NULL)
                E_FATAL("gs_read(%s) failed\n", gsfile);

            E_INFO("After reading the number of senones: %d\n",
                   kb->gs->n_mgau);
        }
        /* SVQ and GS-specific checking should be done */
    }
    else {
        E_INFO
            ("Slow GMM computation is used, SVQ and GS will not be used\n");
    }

    assert(kb->dict);
    
#if 0
    if (cmd_ln_str_r(config, "-lm") || cmd_ln_str_r(config, "-lmctlfn")) {
        kb->lmset = lmset_init(cmd_ln_str_r(config, "-lm"),
                               cmd_ln_str_r(config, "-lmctlfn"),
                               cmd_ln_str_r(config, "-ctl_lm"),        /* This two are ugly. */
                               cmd_ln_str_r(config, "-lmname"),
                               cmd_ln_str_r(config, "-lmdumpdir"),
                               cmd_ln_float32_r(config, "-lw"),
                               cmd_ln_float32_r(config, "-wip"),
                               cmd_ln_float32_r(config, "-uw"),
                               kb->dict,
                               kb->logmath);

        /* CHECK: check whether LM has a start word and end word  */
        for (i = 0; i < kb->lmset->n_lm; i++) {
            checkLMstartword(kb->lmset->lmarray[i],
                             lmset_idx_to_name(kb->lmset, i));
        }

    }
#endif

    if (cmd_ln_str_r(config, "-fillpen") || kb->dict) {
        if (!kb->dict)          /* Sic */
            E_FATAL
                ("No dictionary for associating filler penalty file(%s)\n",
                 cmd_ln_str_r(config, "-fillpen"));

        if ((kb->fillpen =
             fillpen_init(kb->dict,
                          cmd_ln_str_r(config, "-fillpen"),
                          cmd_ln_float32_r(config, "-silprob"),
                          cmd_ln_float32_r(config, "-fillprob"),
                          cmd_ln_float32_r(config, "-lw"),
                          cmd_ln_float32_r(config, "-wip"),
                          kb->logmath)) == NULL)
            E_FATAL("fillpen_init(%s) failed\n", cmd_ln_str_r(config, "-fillpen"));
    }

    if (REPORT_KBCORE) {
        fillpen_report(kb->fillpen);
    }

    assert(kb->tmat);
    /* CHECK: that HMM topology restrictions are not violated */
    if (tmat_chk_1skip(kb->tmat) < 0)
        E_FATAL
            ("Transition matrices contain arcs skipping more than 1 state, not supported in s3.x's decode\n");

    /* This should be removed and put into the search */
    /* NO KIDDING! */
    if (kb->mdef && kb->dict) { /* Initialize dict2pid */
        int32 composite = 1;
        kb->dict2pid = dict2pid_build(kb->mdef, kb->dict, composite, kb->logmath);
    }

    if (REPORT_KBCORE) {
        dict2pid_report(kb->dict2pid);
    }
    /* ***************** Verifications ***************** */
    if (REPORT_KBCORE)
        E_INFO("Inside kbcore: Verifying models consistency ...... \n");

    if (kb->fcb && kb->mgau) {
        /* Verify feature streams against gauden codebooks */
        if (feat_dimension(kb->fcb) != mgau_veclen(kb->mgau))
            E_FATAL("Feature streamlen(%d) != mgau streamlen(%d)\n",
                    feat_dimension(kb->fcb), mgau_veclen(kb->mgau));
    }


    /* CHECK: Verify whether the <s> and </s> is in the dictionary. */
    if (NOT_S3WID(dict_startwid(kb->dict))
        || NOT_S3WID(dict_finishwid(kb->dict)))
        E_FATAL("%s or %s not in dictionary\n", S3_START_WORD,
                S3_FINISH_WORD);

    /* CHECK: Verify whether <sil> is in the dictionary */
    sil = mdef_silphone(kbcore_mdef(kb));
    if (NOT_S3CIPID(sil))
        E_FATAL("Silence phone '%s' not in mdef\n", S3_SILENCE_CIPHONE);


    E_INFO("End of Initialization of Core Models:\n");
    return kb;
}